

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trampoline.cpp
# Opt level: O2

bool __thiscall ChickenHook::Trampoline::install(Trampoline *this,bool doLock)

{
  undefined8 *puVar1;
  pointer puVar2;
  pointer puVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  undefined7 in_register_00000031;
  ulong uVar15;
  size_t __n;
  int iVar16;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Da_04;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Db_04;
  vector<unsigned_char,_std::allocator<unsigned_char>_> backjump;
  int local_8f8;
  int local_8e8;
  int local_e8;
  
  if ((int)CONCAT71(in_register_00000031,doLock) != 0) {
    lock(this);
    in_XMM0_Da = extraout_XMM0_Da;
    in_XMM0_Db = extraout_XMM0_Db;
  }
  log((double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
  printInfo(this);
  bVar12 = updatePermissions(this->_original_addr,7);
  if (!bVar12) {
    log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    goto LAB_00109357;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_original_code,0x40);
  puVar1 = (undefined8 *)this->_original_addr;
  puVar2 = (this->_original_code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = *puVar1;
  uVar6 = puVar1[1];
  uVar7 = puVar1[2];
  uVar8 = puVar1[3];
  uVar9 = puVar1[4];
  uVar10 = puVar1[5];
  uVar11 = puVar1[7];
  *(undefined8 *)(puVar2 + 0x30) = puVar1[6];
  *(undefined8 *)(puVar2 + 0x38) = uVar11;
  *(undefined8 *)(puVar2 + 0x20) = uVar9;
  *(undefined8 *)(puVar2 + 0x28) = uVar10;
  *(undefined8 *)(puVar2 + 0x10) = uVar7;
  *(undefined8 *)(puVar2 + 0x18) = uVar8;
  *(undefined8 *)puVar2 = uVar5;
  *(undefined8 *)(puVar2 + 8) = uVar6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_real_call_code,0x40);
  generateJump((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
               this->_original_addr,this->_hook_addr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&this->_trampoline);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  puVar2 = (pointer)this->_original_addr;
  uVar17 = extraout_XMM0_Da_01;
  uVar18 = extraout_XMM0_Db_01;
  if (puVar2 != (pointer)0x0) {
    uVar15 = (long)(this->_trampoline).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_trampoline).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    puVar3 = (this->_real_call_code).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memset(&backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish,0,0x94a);
    bVar13 = false;
    iVar16 = 0;
    uVar17 = extraout_XMM0_Da_02;
    uVar18 = extraout_XMM0_Db_02;
    backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar2;
    do {
      if ((uVar15 <= (ulong)(long)iVar16) && (!bVar13)) {
LAB_0010926c:
        if (iVar16 == -1) break;
        log((double)CONCAT44(uVar18,uVar17));
        __n = (size_t)iVar16;
        memcpy((this->_real_call_code).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,this->_original_addr,__n);
        generateJump(&backjump,
                     (this->_real_call_code).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start + __n,
                     (void *)((long)this->_original_addr + __n));
        memcpy((this->_real_call_code).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + __n,
               backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        bVar13 = updatePermissions((this->_real_call_code).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,7);
        if (bVar13) {
          this->_real_call_addr =
               (this->_real_call_code).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
        }
        else {
          log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
          this->_real_call_addr = (void *)0x0;
          puVar2 = (this->_real_call_code).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->_real_call_code).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar2) {
            (this->_real_call_code).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar2;
          }
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        goto LAB_00109344;
      }
      iVar14 = Disasm((PDISASM)&backjump);
      if (local_e8 != 0) goto LAB_0010923c;
      dVar4 = log((double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
      uVar17 = SUB84(dVar4,0);
      uVar18 = (undefined4)((ulong)dVar4 >> 0x20);
      if (local_8f8 != 0) {
        if (local_8f8 == 0xc) {
          if (*backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start != 0xe8) {
            dVar4 = log(dVar4);
            uVar17 = SUB84(dVar4,0);
            uVar18 = (undefined4)((ulong)dVar4 >> 0x20);
            break;
          }
          *(int *)(backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1) =
               (local_8e8 - ((int)puVar3 + iVar16)) + -5;
        }
        else {
          if (((local_8f8 == 0xd) && (uVar15 < (ulong)(long)iVar16)) && (bVar13)) {
            dVar4 = log(dVar4);
            uVar17 = SUB84(dVar4,0);
            uVar18 = (undefined4)((ulong)dVar4 >> 0x20);
            iVar16 = iVar14 + iVar16;
            goto LAB_0010926c;
          }
          dVar4 = log(dVar4);
          uVar17 = SUB84(dVar4,0);
          uVar18 = (undefined4)((ulong)dVar4 >> 0x20);
          bVar13 = true;
        }
      }
      backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + iVar14;
      iVar16 = iVar16 + iVar14;
      dVar4 = log((double)CONCAT44(uVar18,uVar17));
      uVar17 = SUB84(dVar4,0);
      uVar18 = (undefined4)((ulong)dVar4 >> 0x20);
    } while( true );
  }
LAB_001092f6:
  log((double)CONCAT44(uVar18,uVar17));
  this->_real_call_addr = (void *)0x0;
  puVar2 = (this->_real_call_code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_real_call_code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->_real_call_code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
LAB_00109344:
  puVar2 = (this->_trampoline).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  memcpy(this->_original_addr,puVar2,
         (long)(this->_trampoline).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
LAB_00109357:
  if (doLock) {
    unlock(this);
  }
  return bVar12;
LAB_0010923c:
  dVar4 = log((double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
  uVar17 = SUB84(dVar4,0);
  uVar18 = (undefined4)((ulong)dVar4 >> 0x20);
  goto LAB_001092f6;
}

Assistant:

bool Trampoline::install(bool doLock) {
        if (doLock) lock();
        log("Install hook at <%p>", _original_addr);
        printInfo();
        if (!updatePermissions(_original_addr, PROT_NONE | PROT_READ | PROT_WRITE | PROT_EXEC)) {
            log("Unable to update permissions <%p>", _original_addr);

            if (doLock) unlock();
            return false;
        }
        // make backup of original code
        _original_code.resize(CODE_SIZE);
        memcpy(&_original_code[0], _original_addr, CODE_SIZE);


        // create real call code
        _real_call_code.resize(CODE_SIZE); // alloc enough space ;)

        // generate jump in order to determine minimum trampoline size
        _trampoline = generateJump(_original_addr, _hook_addr);


        // check function compatibility and required trampoline size (to not destroy greater instructions)
        int requiredTrampolinSize = nextInstOff(_original_addr, _trampoline.size(),
                                                (char *) &_real_call_code[0]);




        if (requiredTrampolinSize == -1) {
            /**
             * Without landing pad, we have to copy the original code, execute it and install hook again.
             */
            log("Unsupported instructions found.. cannot use landing pad. ");
            _real_call_addr = nullptr;
            _real_call_code.clear();
        } else {
            /**
             * Our hook can call the landing pad instead of the original function in order to execute the original code.
             */
            log("Required trampoline size <%d>", requiredTrampolinSize);


            // copy original code of trampoline size and add trampoline to jump back
            memcpy(&_real_call_code[0], _original_addr, requiredTrampolinSize);
            std::vector<uint8_t> backjump = generateJump(
                    (void *) &_real_call_code[requiredTrampolinSize],
                    (void *) (((char *) _original_addr + (requiredTrampolinSize))));
            memcpy(&_real_call_code[requiredTrampolinSize], &backjump[0], backjump.size());

            // make real call code executable
            if (!updatePermissions(&_real_call_code[0], PROT_READ | PROT_WRITE | PROT_EXEC)) {
                log("Unable to update permissions of landing pad <%p>", &_real_call_code[0]);

                _real_call_addr = nullptr;
                _real_call_code.clear();
            } else {
                _real_call_addr = &_real_call_code[0];
                log("Created landing pad at <%p>", _real_call_addr);
            }
        }

        // insert jump to hooking function
        memcpy(_original_addr, &_trampoline[0], _trampoline.size());


        /*if (!updatePermissions(_original_addr, PROT_READ | PROT_EXEC)) {
            if (doLock) unlock();
            return true; // this doesn't break our use-case
        }*/


        if (doLock) unlock();
        return true;
    }